

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void apx_server_unregister_event_listener(apx_server_t *self,void *handle)

{
  _Bool _Var1;
  
  if (handle != (void *)0x0 && self != (apx_server_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&self->event_listener_lock);
    _Var1 = adt_list_remove(&self->server_event_listeners,handle);
    pthread_mutex_unlock((pthread_mutex_t *)&self->event_listener_lock);
    if (_Var1) {
      apx_serverEventListener_vdelete(handle);
      return;
    }
  }
  return;
}

Assistant:

void apx_server_unregister_event_listener(apx_server_t *self, void *handle)
{
   if ( (self != NULL) && (handle != 0))
   {
      bool isFound;
      MUTEX_LOCK(self->event_listener_lock);
      isFound = adt_list_remove(&self->server_event_listeners, handle);
      MUTEX_UNLOCK(self->event_listener_lock);
      if (isFound == true)
      {
         apx_serverEventListener_vdelete(handle);
      }
   }
}